

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O2

void canvas_setundo(_glist *x,t_undofn undofn,void *buf,char *name)

{
  void *pvVar1;
  bool bVar2;
  int iVar3;
  _instanceeditor *p_Var4;
  char *format;
  
  p_Var4 = (pd_maininstance.pd_gui)->i_editor;
  bVar2 = true;
  if ((*(code **)(p_Var4 + 0x18) != (code *)0x0) &&
     (pvVar1 = *(void **)(p_Var4 + 0x28), pvVar1 != buf && pvVar1 != (void *)0x0)) {
    bVar2 = false;
    (**(code **)(p_Var4 + 0x18))(*(undefined8 *)(p_Var4 + 0x30),pvVar1,0);
    p_Var4 = (pd_maininstance.pd_gui)->i_editor;
  }
  *(_glist **)(p_Var4 + 0x30) = x;
  *(t_undofn *)(p_Var4 + 0x18) = undofn;
  *(void **)(p_Var4 + 0x28) = buf;
  *(undefined4 *)(p_Var4 + 0x20) = 1;
  *(char **)(p_Var4 + 0x38) = name;
  if (x != (_glist *)0x0) {
    iVar3 = glist_isvisible(x);
    if (iVar3 != 0) {
      iVar3 = glist_istoplevel(x);
      if (iVar3 != 0) {
        format = "^ss";
        goto LAB_00138b96;
      }
    }
  }
  if (bVar2) {
    return;
  }
  format = "rss";
  name = "no";
  x = (_glist *)"nobody";
LAB_00138b96:
  pdgui_vmess("pdtk_undomenu",format,x,name,"no");
  return;
}

Assistant:

void canvas_setundo(t_canvas *x, t_undofn undofn, void *buf,
    const char *name)
{
    int hadone = 0;
        /* blow away the old undo information.  In one special case the
           old undo info is re-used; if so we shouldn't free it here. */
    if (EDITOR->canvas_undo_fn && EDITOR->canvas_undo_buf && (buf != EDITOR->canvas_undo_buf))
    {
        (*EDITOR->canvas_undo_fn)(EDITOR->canvas_undo_canvas, EDITOR->canvas_undo_buf, UNDO_FREE);
        hadone = 1;
    }
    EDITOR->canvas_undo_canvas = x;
    EDITOR->canvas_undo_fn = undofn;
    EDITOR->canvas_undo_buf = buf;
    EDITOR->canvas_undo_whatnext = UNDO_UNDO;
    EDITOR->canvas_undo_name = name;
    if (x && glist_isvisible(x) && glist_istoplevel(x))
            /* enable undo in menu */
        pdgui_vmess("pdtk_undomenu", "^ss", x, name, "no");
    else if (hadone)
        pdgui_vmess("pdtk_undomenu", "rss", "nobody", "no", "no");
}